

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.h
# Opt level: O0

_Bool tf_alloc_and_reset_data(TemporalFilterData *tf_data,int num_pels,int is_high_bitdepth)

{
  void *pvVar1;
  int in_EDX;
  void *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var2;
  
  pvVar1 = aom_calloc(CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(size_t)in_RDI);
  *(void **)((long)in_RDI + 0x10) = pvVar1;
  pvVar1 = aom_memalign((size_t)tf_data,CONCAT44(num_pels,is_high_bitdepth));
  *(void **)((long)in_RDI + 0x18) = pvVar1;
  pvVar1 = aom_memalign((size_t)tf_data,CONCAT44(num_pels,is_high_bitdepth));
  *(void **)((long)in_RDI + 0x20) = pvVar1;
  if (in_EDX == 0) {
    pvVar1 = aom_memalign((size_t)tf_data,CONCAT44(num_pels,is_high_bitdepth));
    *(void **)((long)in_RDI + 0x28) = pvVar1;
  }
  else {
    pvVar1 = aom_memalign((size_t)tf_data,CONCAT44(num_pels,is_high_bitdepth));
    *(ulong *)((long)in_RDI + 0x28) = (ulong)pvVar1 >> 1;
  }
  if ((((*(long *)((long)in_RDI + 0x10) == 0) || (*(long *)((long)in_RDI + 0x18) == 0)) ||
      (*(long *)((long)in_RDI + 0x20) == 0)) || (*(long *)((long)in_RDI + 0x28) == 0)) {
    _Var2 = false;
  }
  else {
    memset(in_RDI,0,0x10);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static inline bool tf_alloc_and_reset_data(TemporalFilterData *tf_data,
                                           int num_pels, int is_high_bitdepth) {
  tf_data->tmp_mbmi = (MB_MODE_INFO *)aom_calloc(1, sizeof(*tf_data->tmp_mbmi));
  tf_data->accum =
      (uint32_t *)aom_memalign(16, num_pels * sizeof(*tf_data->accum));
  tf_data->count =
      (uint16_t *)aom_memalign(16, num_pels * sizeof(*tf_data->count));
  if (is_high_bitdepth)
    tf_data->pred = CONVERT_TO_BYTEPTR(
        aom_memalign(32, num_pels * 2 * sizeof(*tf_data->pred)));
  else
    tf_data->pred =
        (uint8_t *)aom_memalign(32, num_pels * sizeof(*tf_data->pred));
  // In case of an allocation failure, other successfully allocated buffers will
  // be freed by the tf_dealloc_data() call in encoder_destroy().
  if (!(tf_data->tmp_mbmi && tf_data->accum && tf_data->count && tf_data->pred))
    return false;
  memset(&tf_data->diff, 0, sizeof(tf_data->diff));
  return true;
}